

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_sched.c
# Opt level: O0

void clock_unset(_clock *x)

{
  _clock *local_18;
  _clock *x2;
  _clock *x_local;
  
  if (0.0 <= x->c_settime) {
    if (x == pd_maininstance.pd_clock_setlist) {
      pd_maininstance.pd_clock_setlist = x->c_next;
    }
    else {
      for (local_18 = pd_maininstance.pd_clock_setlist; local_18->c_next != x;
          local_18 = local_18->c_next) {
      }
      local_18->c_next = x->c_next;
    }
    x->c_settime = -1.0;
  }
  return;
}

Assistant:

void clock_unset(t_clock *x)
{
    if (x->c_settime >= 0)
    {
        if (x == pd_this->pd_clock_setlist)
            pd_this->pd_clock_setlist = x->c_next;
        else
        {
            t_clock *x2 = pd_this->pd_clock_setlist;
            while (x2->c_next != x) x2 = x2->c_next;
            x2->c_next = x->c_next;
        }
        x->c_settime = -1;
    }
}